

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

int Eigen::internal::first_aligned<double,int>(double *array,int size)

{
  int *piVar1;
  uint local_20;
  int local_1c;
  double *pdStack_18;
  int size_local;
  double *array_local;
  
  array_local._4_4_ = size;
  if (((ulong)array & 7) == 0) {
    local_20 = 2 - ((uint)((ulong)array >> 3) & 1) & 1;
    local_1c = size;
    pdStack_18 = array;
    piVar1 = std::min<int>((int *)&local_20,&local_1c);
    array_local._4_4_ = *piVar1;
  }
  return array_local._4_4_;
}

Assistant:

static inline Index first_aligned(const Scalar* array, Index size)
{
  static const Index PacketSize = packet_traits<Scalar>::size;
  static const Index PacketAlignedMask = PacketSize-1;

  if(PacketSize==1)
  {
    // Either there is no vectorization, or a packet consists of exactly 1 scalar so that all elements
    // of the array have the same alignment.
    return 0;
  }
  else if(size_t(array) & (sizeof(Scalar)-1))
  {
    // There is vectorization for this scalar type, but the array is not aligned to the size of a single scalar.
    // Consequently, no element of the array is well aligned.
    return size;
  }
  else
  {
    return std::min<Index>( (PacketSize - (Index((size_t(array)/sizeof(Scalar))) & PacketAlignedMask))
                           & PacketAlignedMask, size);
  }
}